

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light.cpp
# Opt level: O0

Spectrum __thiscall
CMU462::StaticScene::PointLight::sample_L
          (PointLight *this,Vector3D *p,Vector3D *wi,float *distToLight,float *pdf)

{
  double dVar1;
  Vector3D local_70;
  undefined1 local_58 [8];
  Vector3D d;
  float *pdf_local;
  float *distToLight_local;
  Vector3D *wi_local;
  Vector3D *p_local;
  PointLight *this_local;
  
  d.z = (double)pdf;
  Vector3D::operator-((Vector3D *)local_58,&this->position,p);
  Vector3D::unit(&local_70,(Vector3D *)local_58);
  wi->z = local_70.z;
  wi->x = local_70.x;
  wi->y = local_70.y;
  dVar1 = Vector3D::norm((Vector3D *)local_58);
  *distToLight = (float)dVar1;
  *(undefined4 *)d.z = 0x3f800000;
  return this->radiance;
}

Assistant:

Spectrum PointLight::sample_L(const Vector3D& p, Vector3D* wi,
                             float* distToLight,
                             float* pdf) const {
  Vector3D d = position - p;
  *wi = d.unit();
  *distToLight = d.norm();
  *pdf = 1.0;
  return radiance;
}